

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalCommonGenerator::GetTargetFortranFlags
          (string *__return_storage_ptr__,cmLocalCommonGenerator *this,cmGeneratorTarget *target,
          string *config)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  string *psVar3;
  cmValue cVar4;
  cmAlphaNum *this_00;
  _Alloc_hider _Var5;
  string_view source;
  string_view source_00;
  string incflag;
  string mod_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string modflag;
  cmAlphaNum local_118;
  string local_e8;
  string local_c8;
  string local_a8;
  cmAlphaNum local_88;
  cmLocalCommonGenerator *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CMAKE_Fortran_MODOUT_FLAG",(allocator<char> *)&local_88);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
  (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(this,__return_storage_ptr__,psVar3);
  std::__cxx11::string::~string((string *)&local_118);
  psVar3 = GetWorkingDirectory_abi_cxx11_(this);
  cmGeneratorTarget::GetFortranModuleDirectory(&local_c8,target,psVar3);
  if ((char *)local_c8._M_string_length == (char *)0x0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CMAKE_Fortran_MODDIR_DEFAULT",(allocator<char> *)&local_88);
    cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
    std::__cxx11::string::_M_assign((string *)&local_c8);
    this_00 = &local_118;
  }
  else {
    MaybeRelativeToWorkDir((string *)&local_88,this,&local_c8);
    source._M_str = (char *)local_88.View_._M_len;
    source._M_len = (size_t)local_88.View_._M_str;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&local_118,&(this->super_cmLocalGenerator).super_cmOutputConverter,source,
               SHELL);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    this_00 = &local_88;
  }
  std::__cxx11::string::~string((string *)this_00);
  if ((char *)local_c8._M_string_length != (char *)0x0) {
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"CMAKE_Fortran_MODDIR_FLAG",(allocator<char> *)&local_a8);
    psVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_e8);
    local_118.View_._M_str = (psVar3->_M_dataplus)._M_p;
    local_118.View_._M_len = psVar3->_M_string_length;
    local_88.View_._M_len = local_c8._M_string_length;
    local_88.View_._M_str = local_c8._M_dataplus._M_p;
    cmStrCat<>(&local_50,&local_118,&local_88);
    std::__cxx11::string::~string((string *)&local_e8);
    (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this,__return_storage_ptr__,&local_50);
    pcVar1 = (this->super_cmLocalGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"CMAKE_Fortran_MODDIR_INCLUDE_FLAG",(allocator<char> *)&local_88
              );
    psVar3 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_118);
    std::__cxx11::string::string((string *)&local_e8,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_118);
    if ((char *)local_e8._M_string_length != (char *)0x0) {
      local_118.View_._M_len = local_e8._M_string_length;
      local_118.View_._M_str = local_e8._M_dataplus._M_p;
      local_88.View_._M_len = local_c8._M_string_length;
      local_88.View_._M_str = local_c8._M_dataplus._M_p;
      cmStrCat<>(&local_a8,&local_118,&local_88);
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (this,__return_storage_ptr__,&local_e8);
    }
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pcVar1 = (this->super_cmLocalGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CMAKE_Fortran_MODPATH_FLAG",(allocator<char> *)&local_88);
  cVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  if (cVar4.Value != (string *)0x0) {
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"C",(allocator<char> *)&local_88);
    cmLocalGenerator::GetIncludeDirectories
              (&this->super_cmLocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_a8,target,(string *)&local_118,config);
    std::__cxx11::string::~string((string *)&local_118);
    sVar2 = local_a8._M_string_length;
    local_58 = this;
    for (_Var5._M_p = local_a8._M_dataplus._M_p; _Var5._M_p != (pointer)sVar2;
        _Var5._M_p = _Var5._M_p + 0x20) {
      local_118.View_._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
      local_118.View_._M_len = (cVar4.Value)->_M_string_length;
      source_00._M_str = *(char **)_Var5._M_p;
      source_00._M_len = *(size_t *)(_Var5._M_p + 8);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_e8,&(this->super_cmLocalGenerator).super_cmOutputConverter,source_00,SHELL);
      local_88.View_._M_len = local_e8._M_string_length;
      local_88.View_._M_str = local_e8._M_dataplus._M_p;
      cmStrCat<>(&local_50,&local_118,&local_88);
      std::__cxx11::string::~string((string *)&local_e8);
      (*(local_58->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
                (local_58,__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalCommonGenerator::GetTargetFortranFlags(
  cmGeneratorTarget const* target, std::string const& config)
{
  std::string flags;

  // Enable module output if necessary.
  this->AppendFlags(
    flags, this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODOUT_FLAG"));

  // Add a module output directory flag if necessary.
  std::string mod_dir =
    target->GetFortranModuleDirectory(this->GetWorkingDirectory());
  if (!mod_dir.empty()) {
    mod_dir = this->ConvertToOutputFormat(
      this->MaybeRelativeToWorkDir(mod_dir), cmOutputConverter::SHELL);
  } else {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
  }
  if (!mod_dir.empty()) {
    std::string modflag = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG"),
      mod_dir);
    this->AppendFlags(flags, modflag);
    // Some compilers do not search their own module output directory
    // for using other modules.  Add an include directory explicitly
    // for consistency with compilers that do search it.
    std::string incflag =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_INCLUDE_FLAG");
    if (!incflag.empty()) {
      incflag = cmStrCat(incflag, mod_dir);
      this->AppendFlags(flags, incflag);
    }
  }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if (cmValue modpath_flag =
        this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG")) {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, target, "C", config);
    for (std::string const& id : includes) {
      std::string flg =
        cmStrCat(*modpath_flag,
                 this->ConvertToOutputFormat(id, cmOutputConverter::SHELL));
      this->AppendFlags(flags, flg);
    }
  }

  return flags;
}